

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_40de81::InlineImageTracker::handleToken(InlineImageTracker *this,Token *token)

{
  QPDF *qpdf;
  undefined8 uVar1;
  bool bVar2;
  token_type_e tVar3;
  string *psVar4;
  longlong value;
  int *min_suffix;
  InlineImageTracker *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  QPDFObjectHandle local_148;
  undefined1 local_138 [24];
  QPDFObjectHandle image;
  string local_110;
  undefined1 local_f0 [8];
  string name;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  QPDFObjectHandle local_60;
  undefined1 local_50 [8];
  QPDFObjectHandle dict;
  size_t len;
  string image_data;
  Token *token_local;
  InlineImageTracker *this_local;
  
  image_data.field_2._8_8_ = token;
  if (this->state == st_bi) {
    tVar3 = QPDFTokenizer::Token::getType(token);
    uVar1 = image_data.field_2._8_8_;
    if (tVar3 == tt_inline_image) {
      psVar4 = QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)image_data.field_2._8_8_);
      std::__cxx11::string::string((string *)&len,(string *)psVar4);
      dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::length();
      if (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->min_size) {
        __n = this;
        QTC::TC("qpdf","QPDFPageObjectHelper keep inline image",0);
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)this + 0x50,__buf_01,(size_t)__n);
        QPDFObjectHandle::TokenFilter::writeToken
                  (&this->super_TokenFilter,(Token *)image_data.field_2._8_8_);
        this->state = st_top;
      }
      else {
        QTC::TC("qpdf","QPDFPageObjectHelper externalize inline image",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
        QPDFObjectHandle::parse(&local_60,&this->dict_str,&local_80);
        convertIIDict((InlineImageTracker *)local_50,(QPDFObjectHandle *)this);
        QPDFObjectHandle::~QPDFObjectHandle(&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"/Length",&local_b9);
        value = QIntC::to_longlong<unsigned_long>
                          ((unsigned_long *)
                           &dict.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::newInteger((QPDFObjectHandle *)((long)&name.field_2 + 8),value);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_50,&local_b8,
                   (QPDFObjectHandle *)((long)&name.field_2 + 8));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&name.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"/IIm",
                   (allocator<char> *)
                   ((long)&image.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        min_suffix = &this->min_suffix;
        QPDFObjectHandle::getUniqueResourceName
                  ((string *)local_f0,&this->resources,&local_110,min_suffix,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&image.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        qpdf = this->qpdf;
        std::make_shared<Buffer,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
        QPDFObjectHandle::newStream
                  ((QPDFObjectHandle *)(local_138 + 0x10),qpdf,(shared_ptr<Buffer> *)local_138);
        std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_138);
        QPDFObjectHandle::replaceDict
                  ((QPDFObjectHandle *)(local_138 + 0x10),(QPDFObjectHandle *)local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_168,"/XObject",&local_169);
        QPDFObjectHandle::getKey(&local_148,(string *)&this->resources);
        QPDFObjectHandle::replaceKey
                  (&local_148,(string *)local_f0,(QPDFObjectHandle *)(local_138 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle(&local_148);
        std::__cxx11::string::~string(local_168);
        std::allocator<char>::~allocator(&local_169);
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)local_f0,__buf,(size_t)min_suffix);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_190," Do\n",&local_191);
        QPDFObjectHandle::TokenFilter::write
                  (&this->super_TokenFilter,(int)local_190,__buf_00,(size_t)min_suffix);
        std::__cxx11::string::~string(local_190);
        std::allocator<char>::~allocator(&local_191);
        this->any_images = true;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_138 + 0x10));
        std::__cxx11::string::~string((string *)local_f0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_50);
      }
      std::__cxx11::string::~string((string *)&len);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"ID",&local_1b9);
      bVar2 = QPDFTokenizer::Token::isWord((Token *)uVar1,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      uVar1 = image_data.field_2._8_8_;
      if (bVar2) {
        psVar4 = QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)image_data.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)&this->bi_str,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)&this->dict_str," >>");
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"EI",&local_1e1);
        bVar2 = QPDFTokenizer::Token::isWord((Token *)uVar1,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        if (bVar2) {
          this->state = st_top;
        }
        else {
          psVar4 = QPDFTokenizer::Token::getRawValue_abi_cxx11_((Token *)image_data.field_2._8_8_);
          std::__cxx11::string::operator+=((string *)&this->bi_str,(string *)psVar4);
          psVar4 = QPDFTokenizer::Token::getRawValue_abi_cxx11_((Token *)image_data.field_2._8_8_);
          std::__cxx11::string::operator+=((string *)&this->dict_str,(string *)psVar4);
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"BI",&local_209);
    bVar2 = QPDFTokenizer::Token::isWord(token,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    if (bVar2) {
      psVar4 = QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)image_data.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&this->bi_str,(string *)psVar4);
      std::__cxx11::string::operator=((string *)&this->dict_str,"<< ");
      this->state = st_bi;
    }
    else {
      QPDFObjectHandle::TokenFilter::writeToken
                (&this->super_TokenFilter,(Token *)image_data.field_2._8_8_);
    }
  }
  return;
}

Assistant:

void
InlineImageTracker::handleToken(QPDFTokenizer::Token const& token)
{
    if (state == st_bi) {
        if (token.getType() == QPDFTokenizer::tt_inline_image) {
            std::string image_data(token.getValue());
            size_t len = image_data.length();
            if (len >= this->min_size) {
                QTC::TC("qpdf", "QPDFPageObjectHelper externalize inline image");
                QPDFObjectHandle dict = convertIIDict(QPDFObjectHandle::parse(dict_str));
                dict.replaceKey("/Length", QPDFObjectHandle::newInteger(QIntC::to_longlong(len)));
                std::string name = resources.getUniqueResourceName("/IIm", this->min_suffix);
                QPDFObjectHandle image = QPDFObjectHandle::newStream(
                    this->qpdf, std::make_shared<Buffer>(std::move(image_data)));
                image.replaceDict(dict);
                resources.getKey("/XObject").replaceKey(name, image);
                write(name);
                write(" Do\n");
                any_images = true;
            } else {
                QTC::TC("qpdf", "QPDFPageObjectHelper keep inline image");
                write(bi_str);
                writeToken(token);
                state = st_top;
            }
        } else if (token.isWord("ID")) {
            bi_str += token.getValue();
            dict_str += " >>";
        } else if (token.isWord("EI")) {
            state = st_top;
        } else {
            bi_str += token.getRawValue();
            dict_str += token.getRawValue();
        }
    } else if (token.isWord("BI")) {
        bi_str = token.getValue();
        dict_str = "<< ";
        state = st_bi;
    } else {
        writeToken(token);
    }
}